

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curi.c
# Opt level: O2

curi_status
curi_url_decode(char *input,size_t inputLen,char *output,size_t outputCapacity,size_t *outputLen)

{
  char cVar1;
  curi_status cVar2;
  int iVar3;
  uint uVar4;
  char *c;
  char *pcVar5;
  ushort **ppuVar6;
  __int32_t **pp_Var7;
  ulong uVar8;
  size_t __TRY_initialOffset;
  size_t sVar9;
  int iVar10;
  ulong uVar11;
  size_t local_50;
  char *local_48;
  ulong *local_40;
  ushort *local_38;
  
  local_50 = 0;
  uVar8 = 0;
  local_48 = output;
  local_40 = outputLen;
LAB_0010202d:
  sVar9 = local_50;
  pcVar5 = input + local_50;
  if (inputLen <= local_50) {
    pcVar5 = "";
  }
  if (uVar8 < outputCapacity) {
    uVar11 = local_50 + 1;
    if ((*pcVar5 == '%') &&
       (local_50 = uVar11, cVar2 = parse_h8(input,inputLen,&local_50,(curi_settings *)"",outputLen),
       cVar2 != curi_status_error)) goto code_r0x00102079;
    goto LAB_001020fe;
  }
  if (*pcVar5 != '\0') {
    return curi_status_error;
  }
LAB_00102144:
  if (local_40 != (ulong *)0x0) {
    *local_40 = uVar8;
  }
  return curi_status_success;
code_r0x00102079:
  if (cVar2 == curi_status_success) {
    ppuVar6 = __ctype_b_loc();
    sVar9 = local_50;
    local_38 = *ppuVar6;
    cVar1 = input[local_50 - 2];
    if ((*(byte *)((long)local_38 + (long)cVar1 * 2 + 1) & 8) == 0) {
      pp_Var7 = __ctype_tolower_loc();
      iVar10 = (*pp_Var7)[cVar1] + -0x57;
    }
    else {
      iVar10 = cVar1 + -0x30;
      pp_Var7 = __ctype_tolower_loc();
    }
    iVar3 = (*pp_Var7)[input[sVar9 - 1]];
    if ((*(byte *)((long)local_38 + (long)iVar3 * 2 + 1) & 8) == 0) {
      iVar3 = tolower(iVar3);
      uVar4 = iVar3 - 0x57;
    }
    else {
      uVar4 = iVar3 - 0x30;
    }
    uVar4 = iVar10 << 4 | uVar4;
    if ((int)uVar4 < 0x80) {
      local_48[uVar8] = (char)uVar4;
    }
    else {
      uVar11 = sVar9 + 1;
LAB_001020fe:
      pcVar5 = input + sVar9;
      if (inputLen <= sVar9) {
        pcVar5 = "";
      }
      cVar1 = *pcVar5;
      local_50 = uVar11;
      if (cVar1 == '+') {
        local_48[uVar8] = ' ';
      }
      else {
        local_48[uVar8] = cVar1;
        if (cVar1 == '\0') goto LAB_00102144;
      }
    }
    uVar8 = uVar8 + 1;
  }
  goto LAB_0010202d;
}

Assistant:

curi_status curi_url_decode(const char* input, size_t inputLen, char* output, size_t outputCapacity, size_t* outputLen /*=0*/)
{
    curi_status status = curi_status_error;
    size_t inputOffset = 0;
    size_t outputOffset = 0;

    #define HEXTOI(x) (isdigit(x) ? x - '0' : tolower(x) - 'a' + 10)

    while ( outputOffset < outputCapacity )
    {
        status = curi_status_error;
        if (status == curi_status_error)
        {
            // percent encoding
            TRY(status, &inputOffset, parse_percent_encoded(input, inputLen, &inputOffset, 0, 0));

            if (status == curi_status_success)
            {
                int encodedChar = ((HEXTOI(input[inputOffset - 2]) << 4) | HEXTOI(tolower(input[inputOffset - 1])));
                if (encodedChar < 128) // Only support ascii percent encodage at the moment.
                {
                    output[outputOffset] = (char)encodedChar;
                    ++outputOffset;
                }
                else
                {
                    status = curi_status_error;
                }
            }
        }

        if (status == curi_status_error)
        {
            // '+' as a space
            TRY(status, &inputOffset, parse_char('+', input, inputLen, &inputOffset, 0, 0));
            if (status == curi_status_success)
            {
                 output[outputOffset] = ' ';
                 ++outputOffset;
            }
        }

        if (status == curi_status_error)
        {
            // "any" character
            output[outputOffset] = *read_char(input, inputLen, &inputOffset);
            if (output[outputOffset] == '\0')
            {
                if (outputLen)
                    *outputLen = outputOffset;

                return curi_status_success;
            }
            else
            {
                ++outputOffset;
            }
        }
    }

    if (*read_char(input, inputLen, &inputOffset) == '\0')
    {
        if (outputLen)
            *outputLen = outputOffset;

        return curi_status_success;
    }
    else
    {
        return curi_status_error;
    }
}